

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O0

back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>
pstore::details::decode4<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
          (array<unsigned_char,_4UL> *in,
          back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> out,uint count)

{
  value_type vVar1;
  byte bVar2;
  value_type vVar3;
  const_reference pvVar4;
  byte *pbVar5;
  reference pvVar6;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> *this;
  uint local_2c;
  array<unsigned_char,_3UL> local_27;
  uint ctr;
  array<unsigned_char,_3UL> result;
  array<unsigned_char,_4UL> *paStack_20;
  uint count_local;
  array<unsigned_char,_4UL> *in_local;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> out_local;
  
  ctr = count;
  paStack_20 = in;
  in_local = (array<unsigned_char,_4UL> *)out.container;
  pvVar4 = std::array<unsigned_char,_4UL>::operator[](in,0);
  vVar1 = *pvVar4;
  pbVar5 = std::array<unsigned_char,_4UL>::operator[](paStack_20,1);
  bVar2 = *pbVar5;
  pvVar6 = std::array<unsigned_char,_3UL>::operator[](&local_27,0);
  *pvVar6 = vVar1 * '\x04' + (char)((bVar2 & 0x30) >> 4);
  pvVar4 = std::array<unsigned_char,_4UL>::operator[](paStack_20,1);
  vVar1 = *pvVar4;
  pbVar5 = std::array<unsigned_char,_4UL>::operator[](paStack_20,2);
  bVar2 = *pbVar5;
  pvVar6 = std::array<unsigned_char,_3UL>::operator[](&local_27,1);
  *pvVar6 = vVar1 * '\x10' + (char)((bVar2 & 0x3c) >> 2);
  pvVar4 = std::array<unsigned_char,_4UL>::operator[](paStack_20,2);
  vVar1 = *pvVar4;
  pvVar4 = std::array<unsigned_char,_4UL>::operator[](paStack_20,3);
  vVar3 = *pvVar4;
  pvVar6 = std::array<unsigned_char,_3UL>::operator[](&local_27,2);
  *pvVar6 = vVar1 * '@' + vVar3;
  for (local_2c = 0; local_2c < ctr; local_2c = local_2c + 1) {
    pvVar6 = std::array<unsigned_char,_3UL>::operator[](&local_27,(ulong)local_2c);
    this = std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator*
                     ((back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> *)&in_local
                     );
    std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator=(this,pvVar6);
    std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator++
              ((back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> *)&in_local);
  }
  return (back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>)
         (small_vector<unsigned_char,_128UL> *)in_local;
}

Assistant:

OutputIterator decode4 (std::array<std::uint8_t, 4> const & in, OutputIterator out,
                                unsigned const count) {
            std::array<std::uint8_t, 3> result;
            result[0] = static_cast<std::uint8_t> (static_cast<std::uint8_t> (in[0] << 2) +
                                                   ((in[1] & 0x30U) >> 4));
            result[1] = static_cast<std::uint8_t> (((in[1] & 0xFU) << 4) + ((in[2] & 0x3CU) >> 2));
            result[2] = static_cast<std::uint8_t> (((in[2] & 0x3U) << 6) + in[3]);
            for (auto ctr = 0U; ctr < count; ++ctr) {
                *out = result[ctr];
                ++out;
            }
            return out;
        }